

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O2

bool __thiscall
index::equal_word(index *this,wstring *word,wstring *content,size_t begin,size_t size)

{
  __type _Var1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_30;
  
  std::__cxx11::wstring::substr((ulong)&local_30,(ulong)content);
  _Var1 = std::operator==(word,&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  return _Var1;
}

Assistant:

bool index::equal_word(const std::wstring& word, const std::wstring& content, std::size_t begin, std::size_t size)
{
    return word == content.substr(begin, size);
}